

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O0

int writeString(FILE *str,CURL *curl,char *key,CURLINFO ci)

{
  int iVar1;
  char *local_38;
  char *valp;
  char *pcStack_28;
  CURLINFO ci_local;
  char *key_local;
  CURL *curl_local;
  FILE *str_local;
  
  local_38 = (char *)0x0;
  valp._4_4_ = ci;
  pcStack_28 = key;
  key_local = (char *)curl;
  curl_local = (CURL *)str;
  iVar1 = curl_easy_getinfo(curl,ci,&local_38);
  if ((iVar1 == 0) && (local_38 != (char *)0x0)) {
    curl_mfprintf(curl_local,"\"%s\":\"",pcStack_28);
    jsonEscape((FILE *)curl_local,local_38);
    curl_mfprintf(curl_local,"\"");
    str_local._4_4_ = 1;
  }
  else {
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

static int writeString(FILE *str, CURL *curl, const char *key, CURLINFO ci)
{
  char *valp = NULL;
  if((CURLE_OK == curl_easy_getinfo(curl, ci, &valp)) && valp) {
    fprintf(str, "\"%s\":\"", key);
    jsonEscape(str, valp);
    fprintf(str, "\"");
    return 1;
  }
  return 0;
}